

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O2

bool __thiscall pm::Sphere::shadowHit(Sphere *this,Ray *ray,float *tMin)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  if ((this->super_Geometry).castShadows_ == false) {
    return false;
  }
  fVar4 = (ray->o).x - (this->center_).x;
  fVar1 = (ray->o).y - (this->center_).y;
  fVar2 = (ray->o).z - (this->center_).z;
  fVar3 = dot(&ray->d,&ray->d);
  fVar5 = (ray->d).z * fVar2 + (ray->d).x * fVar4 + (ray->d).y * fVar1;
  fVar5 = fVar5 + fVar5;
  fVar1 = fVar5 * fVar5 +
          fVar3 * -4.0 *
          ((fVar2 * fVar2 + fVar4 * fVar4 + fVar1 * fVar1) - this->radius_ * this->radius_);
  if (0.0 < fVar1) {
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    fVar2 = (-fVar5 - fVar1) / (fVar3 + fVar3);
    if ((1e-09 < fVar2) || (fVar2 = (fVar1 - fVar5) / (fVar3 + fVar3), 1e-09 < fVar2)) {
      *tMin = fVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool Sphere::shadowHit(const Ray &ray, float &tMin) const
{
	if (castShadows_ == false)
		return false;

	bool hasHit = false;
	const Vector3 temp = ray.o - center_;
	const float a = dot(ray.d, ray.d);
	const float b = 2.0f * dot(temp, ray.d);
	const float c = dot(temp, temp) - radius_ * radius_;
	const float disc = b * b - 4.0f * a * c;

	if (disc > 0.0f)
	{
		float t = 0.0f;
		const float e = sqrtf(disc);
		const float denom = 2.0f * a;

		t = (-b - e) / denom; // smaller root
		if (t > ShadowEpsilon)
		{
			tMin = t;
			hasHit = true;
		}
		else
		{
			t = (-b + e) / denom; // larger root
			if (t > ShadowEpsilon)
			{
				tMin = t;
				hasHit = true;
			}
		}
	}

	return hasHit;
}